

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)13>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  undefined8 *puVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  
  if (0 < count) {
    pbVar3 = src + (long)index * 3 + 2;
    lVar4 = 0;
    do {
      bVar2 = *pbVar3;
      puVar1 = (undefined8 *)((long)&buffer->r + lVar4);
      *puVar1 = CONCAT44((float)(byte)(*(ushort *)(pbVar3 + -2) >> 8) * 0.003921569,
                         (float)(*(ushort *)(pbVar3 + -2) & 0xff) * 0.003921569);
      puVar1[1] = CONCAT44(0x3f800000,(float)bVar2 * 0.003921569);
      pbVar3 = pbVar3 + 3;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}